

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_branch_elim_pass.cpp
# Opt level: O0

bool __thiscall
spvtools::opt::DeadBranchElimPass::MarkLiveBlocks
          (DeadBranchElimPass *this,Function *func,
          unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *live_blocks)

{
  BasicBlock *block_00;
  Instruction *this_00;
  value_type this_01;
  byte bVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t header_id_00;
  uint32_t merge_id;
  Op OVar4;
  reference ppBVar5;
  size_type sVar6;
  IRContext *this_02;
  StructuredCFGAnalysis *this_03;
  pointer ppVar7;
  pair<std::__detail::_Node_iterator<spvtools::opt::BasicBlock_*,_true,_false>,_bool> pVar8;
  undefined1 local_1b8 [16];
  reverse_iterator b;
  function<void_(unsigned_int)> local_198;
  BasicBlock *local_178;
  BasicBlock *const_block;
  pair<spvtools::opt::BasicBlock_*,_unsigned_int> local_168;
  uint32_t local_154;
  StructuredCFGAnalysis *pSStack_150;
  uint32_t header_id;
  undefined1 *local_148;
  StructuredCFGAnalysis **struct_cfg_analysis;
  undefined1 auStack_138 [7];
  bool simplify;
  uint32_t *local_130;
  uint32_t *local_128;
  uint32_t *local_120;
  function<bool_(unsigned_int_*)> local_118;
  uint32_t local_f4 [2];
  uint32_t case_val;
  uint32_t icnt;
  uint32_t sel_val;
  bool condVal;
  Instruction *pIStack_e0;
  uint32_t live_lab_id;
  Instruction *terminator;
  _Node_iterator_base<spvtools::opt::BasicBlock_*,_false> _Stack_d0;
  uint32_t cont_id;
  byte local_c8;
  _Node_iterator_base<spvtools::opt::BasicBlock_*,_false> local_c0;
  byte local_b8;
  value_type local_b0;
  BasicBlock *block;
  undefined1 auStack_a0 [7];
  bool modified;
  reference local_90;
  undefined1 local_88 [8];
  vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> stack;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  blocks_with_backedge;
  vector<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>_>_>
  conditions_to_simplify;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  *live_blocks_local;
  Function *func_local;
  DeadBranchElimPass *this_local;
  
  std::
  vector<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>_>_>
  ::vector((vector<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>_>_>
            *)&blocks_with_backedge._M_h._M_single_bucket);
  std::
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  ::unordered_set((unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                   *)&stack.
                      super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::vector
            ((vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)
             local_88);
  _auStack_a0 = opt::Function::begin(func);
  local_90 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                       ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)auStack_a0);
  std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::push_back
            ((vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)
             local_88,&local_90);
  block._7_1_ = 0;
  while (bVar2 = std::
                 vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
                 empty((vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                        *)local_88), ((bVar2 ^ 0xffU) & 1) != 0) {
    ppBVar5 = std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
              ::back((vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                      *)local_88);
    local_b0 = *ppBVar5;
    std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::pop_back
              ((vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)
               local_88);
    pVar8 = std::
            unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
            ::insert(live_blocks,&local_b0);
    _Stack_d0._M_cur =
         (__node_type *)
         pVar8.first.super__Node_iterator_base<spvtools::opt::BasicBlock_*,_false>._M_cur;
    local_c8 = pVar8.second;
    local_c0._M_cur = _Stack_d0._M_cur;
    local_b8 = local_c8;
    if (((local_c8 ^ 0xff) & 1) == 0) {
      uVar3 = BasicBlock::ContinueBlockIdIfAny(local_b0);
      terminator._4_4_ = uVar3;
      if (uVar3 != 0) {
        header_id_00 = BasicBlock::id(local_b0);
        merge_id = BasicBlock::MergeBlockIdIfAny(local_b0);
        AddBlocksWithBackEdge
                  (this,uVar3,header_id_00,merge_id,
                   (unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                    *)&stack.
                       super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      pIStack_e0 = BasicBlock::terminator(local_b0);
      sel_val = 0;
      OVar4 = opt::Instruction::opcode(pIStack_e0);
      if (OVar4 == OpBranchConditional) {
        uVar3 = opt::Instruction::GetSingleWordInOperand(pIStack_e0,0);
        bVar2 = GetConstCondition(this,uVar3,(bool *)((long)&icnt + 3));
        if (bVar2) {
          uVar3 = 2;
          if ((icnt._3_1_ & 1) != 0) {
            uVar3 = 1;
          }
          sel_val = opt::Instruction::GetSingleWordInOperand(pIStack_e0,uVar3);
        }
      }
      else {
        OVar4 = opt::Instruction::opcode(pIStack_e0);
        if (OVar4 == OpSwitch) {
          uVar3 = opt::Instruction::GetSingleWordInOperand(pIStack_e0,0);
          bVar2 = GetConstInteger(this,uVar3,&case_val);
          this_00 = pIStack_e0;
          if (bVar2) {
            local_f4[1] = 0;
            _auStack_138 = local_f4 + 1;
            local_130 = local_f4;
            local_128 = &case_val;
            local_120 = &sel_val;
            std::function<bool(unsigned_int*)>::
            function<spvtools::opt::DeadBranchElimPass::MarkLiveBlocks(spvtools::opt::Function*,std::unordered_set<spvtools::opt::BasicBlock*,std::hash<spvtools::opt::BasicBlock*>,std::equal_to<spvtools::opt::BasicBlock*>,std::allocator<spvtools::opt::BasicBlock*>>*)::__0,void>
                      ((function<bool(unsigned_int*)> *)&local_118,
                       (anon_class_32_4_78775917 *)auStack_138);
            opt::Instruction::WhileEachInOperand(this_00,&local_118);
            std::function<bool_(unsigned_int_*)>::~function(&local_118);
          }
        }
      }
      struct_cfg_analysis._7_1_ = 0;
      if (sel_val != 0) {
        sVar6 = std::
                unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                ::count((unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                         *)&stack.
                            super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_b0);
        if (sVar6 == 0) {
          struct_cfg_analysis._7_1_ = 1;
        }
        else {
          this_02 = Pass::context((Pass *)this);
          this_03 = IRContext::GetStructuredCFGAnalysis(this_02);
          local_148 = (undefined1 *)&stack0xfffffffffffffeb0;
          pSStack_150 = this_03;
          uVar3 = BasicBlock::id(local_b0);
          local_154 = StructuredCFGAnalysis::ContainingLoop(this_03,uVar3);
          if (sel_val == local_154) {
            struct_cfg_analysis._7_1_ = 1;
          }
        }
      }
      this_01 = local_b0;
      if ((struct_cfg_analysis._7_1_ & 1) == 0) {
        local_178 = local_b0;
        b.current._M_current =
             (__normal_iterator<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>_*,_std::vector<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>_>_>_>
              )local_88;
        std::function<void(unsigned_int)>::
        function<spvtools::opt::DeadBranchElimPass::MarkLiveBlocks(spvtools::opt::Function*,std::unordered_set<spvtools::opt::BasicBlock*,std::hash<spvtools::opt::BasicBlock*>,std::equal_to<spvtools::opt::BasicBlock*>,std::allocator<spvtools::opt::BasicBlock*>>*)::__1,void>
                  ((function<void(unsigned_int)> *)&local_198,(anon_class_16_2_032a43cd *)&b);
        BasicBlock::ForEachSuccessorLabel(this_01,&local_198);
        std::function<void_(unsigned_int)>::~function(&local_198);
      }
      else {
        std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>::
        pair<spvtools::opt::BasicBlock_*&,_unsigned_int_&,_true>(&local_168,&local_b0,&sel_val);
        std::
        vector<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>_>_>
        ::push_back((vector<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>_>_>
                     *)&blocks_with_backedge._M_h._M_single_bucket,&local_168);
        const_block = GetParentBlock(this,sel_val);
        std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
        push_back((vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                   *)local_88,&const_block);
      }
    }
  }
  std::
  vector<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>_>_>
  ::rbegin((vector<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>_>_>
            *)(local_1b8 + 8));
  while( true ) {
    std::
    vector<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>_>_>
    ::rend((vector<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>_>_>
            *)local_1b8);
    bVar2 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>_*,_std::vector<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>_>_>_>_>
                             *)(local_1b8 + 8),
                            (reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>_*,_std::vector<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>_>_>_>_>
                             *)local_1b8);
    bVar1 = block._7_1_;
    if (!bVar2) break;
    ppVar7 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>_*,_std::vector<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>_>_>_>_>
             ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>_*,_std::vector<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>_>_>_>_>
                           *)(local_1b8 + 8));
    block_00 = ppVar7->first;
    ppVar7 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>_*,_std::vector<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>_>_>_>_>
             ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>_*,_std::vector<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>_>_>_>_>
                           *)(local_1b8 + 8));
    bVar2 = SimplifyBranch(this,block_00,ppVar7->second);
    block._7_1_ = (block._7_1_ & 1) != 0 || bVar2;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>_*,_std::vector<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>_>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>_*,_std::vector<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>_>_>_>_>
                  *)(local_1b8 + 8));
  }
  std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::~vector
            ((vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *)
             local_88);
  std::
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  ::~unordered_set((unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                    *)&stack.
                       super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>_>_>
  ::~vector((vector<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*,_unsigned_int>_>_>
             *)&blocks_with_backedge._M_h._M_single_bucket);
  return (bool)(bVar1 & 1);
}

Assistant:

bool DeadBranchElimPass::MarkLiveBlocks(
    Function* func, std::unordered_set<BasicBlock*>* live_blocks) {
  std::vector<std::pair<BasicBlock*, uint32_t>> conditions_to_simplify;
  std::unordered_set<BasicBlock*> blocks_with_backedge;
  std::vector<BasicBlock*> stack;
  stack.push_back(&*func->begin());
  bool modified = false;
  while (!stack.empty()) {
    BasicBlock* block = stack.back();
    stack.pop_back();

    // Live blocks doubles as visited set.
    if (!live_blocks->insert(block).second) continue;

    uint32_t cont_id = block->ContinueBlockIdIfAny();
    if (cont_id != 0) {
      AddBlocksWithBackEdge(cont_id, block->id(), block->MergeBlockIdIfAny(),
                            &blocks_with_backedge);
    }

    Instruction* terminator = block->terminator();
    uint32_t live_lab_id = 0;
    // Check if the terminator has a single valid successor.
    if (terminator->opcode() == spv::Op::OpBranchConditional) {
      bool condVal;
      if (GetConstCondition(terminator->GetSingleWordInOperand(0u), &condVal)) {
        live_lab_id = terminator->GetSingleWordInOperand(
            condVal ? kBranchCondTrueLabIdInIdx : kBranchCondFalseLabIdInIdx);
      }
    } else if (terminator->opcode() == spv::Op::OpSwitch) {
      uint32_t sel_val;
      if (GetConstInteger(terminator->GetSingleWordInOperand(0u), &sel_val)) {
        // Search switch operands for selector value, set live_lab_id to
        // corresponding label, use default if not found.
        uint32_t icnt = 0;
        uint32_t case_val;
        terminator->WhileEachInOperand(
            [&icnt, &case_val, &sel_val, &live_lab_id](const uint32_t* idp) {
              if (icnt == 1) {
                // Start with default label.
                live_lab_id = *idp;
              } else if (icnt > 1) {
                if (icnt % 2 == 0) {
                  case_val = *idp;
                } else {
                  if (case_val == sel_val) {
                    live_lab_id = *idp;
                    return false;
                  }
                }
              }
              ++icnt;
              return true;
            });
      }
    }

    // Don't simplify back edges unless it becomes a branch to the header. Every
    // loop must have exactly one back edge to the loop header, so we cannot
    // remove it.
    bool simplify = false;
    if (live_lab_id != 0) {
      if (!blocks_with_backedge.count(block)) {
        // This is not a back edge.
        simplify = true;
      } else {
        const auto& struct_cfg_analysis = context()->GetStructuredCFGAnalysis();
        uint32_t header_id = struct_cfg_analysis->ContainingLoop(block->id());
        if (live_lab_id == header_id) {
          // The new branch will be a branch to the header.
          simplify = true;
        }
      }
    }

    if (simplify) {
      conditions_to_simplify.push_back({block, live_lab_id});
      stack.push_back(GetParentBlock(live_lab_id));
    } else {
      // All successors are live.
      const auto* const_block = block;
      const_block->ForEachSuccessorLabel([&stack, this](const uint32_t label) {
        stack.push_back(GetParentBlock(label));
      });
    }
  }

  // Traverse |conditions_to_simplify| in reverse order.  This is done so that
  // we simplify nested constructs before simplifying the constructs that
  // contain them.
  for (auto b = conditions_to_simplify.rbegin();
       b != conditions_to_simplify.rend(); ++b) {
    modified |= SimplifyBranch(b->first, b->second);
  }

  return modified;
}